

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

size_t __thiscall CASC_ARRAY::IndexOf(CASC_ARRAY *this,void *pItem)

{
  LPBYTE pBVar1;
  ulong uVar2;
  uint __line;
  char *__assertion;
  
  pBVar1 = this->m_pItemArray;
  if ((pItem < pBVar1) || (uVar2 = this->m_ItemSize, pBVar1 + this->m_ItemCount * uVar2 < pItem)) {
    __assertion = 
    "(m_pItemArray <= pbItem) && (pbItem <= m_pItemArray + (m_ItemCount * m_ItemSize))";
    __line = 0x69;
  }
  else {
    if ((ulong)((long)pItem - (long)pBVar1) % uVar2 == 0) {
      return (ulong)((long)pItem - (long)pBVar1) / uVar2;
    }
    __assertion = "((pbItem - m_pItemArray) % m_ItemSize) == 0";
    __line = 0x6a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                ,__line,"size_t CASC_ARRAY::IndexOf(const void *)");
}

Assistant:

size_t IndexOf(const void * pItem)
    {
        LPBYTE pbItem = (LPBYTE)pItem;

        assert((m_pItemArray <= pbItem) && (pbItem <= m_pItemArray + (m_ItemCount * m_ItemSize)));
        assert(((pbItem - m_pItemArray) % m_ItemSize) == 0);

        return ((pbItem - m_pItemArray) / m_ItemSize);
    }